

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O1

bool __thiscall Screen::displayText(Screen *this,string *text)

{
  uint uVar1;
  ulong uVar2;
  WINDOW **ppWVar3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textFragments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->animationMode == false) {
    updateInfo(this);
    wclear(this->textScreen);
    ppWVar3 = &this->textScreen;
    if ((ulong)(uint)this->textMaxLength < text->_M_string_length) {
      this->currPosition = 0;
      if (text->_M_string_length != 0) {
        do {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)text);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                     &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          uVar1 = this->currPosition + this->textMaxLength;
          this->currPosition = uVar1;
        } while ((ulong)uVar1 < text->_M_string_length);
      }
      uVar2 = (ulong)(uint)this->currentFragment;
      if (uVar2 < (ulong)((long)local_68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_68.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        uVar4 = (ulong)this->currentFragment;
        lVar5 = uVar4 << 5;
        do {
          uVar4 = uVar4 + 1;
          wclear(*ppWVar3);
          wprintw(*ppWVar3,*(undefined8 *)
                            ((long)&((local_68.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar5));
          wrefresh(*ppWVar3);
          if (((long)local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar2) {
            this->currentFragment = 0;
            refreshInput(this);
          }
          else {
            indicateMoreText(this);
          }
          this->currentFragment = this->currentFragment + 1;
          uVar2 = uVar4 & 0xffffffff;
          lVar5 = lVar5 + 0x20;
        } while (uVar2 < (ulong)((long)local_68.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_68.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      goto LAB_00118574;
    }
    std::__cxx11::string::_M_assign((string *)&this->currentText);
    wprintw(*ppWVar3,(this->currentText)._M_dataplus._M_p);
  }
  else {
    wprintw(this->animationScreen,(text->_M_dataplus)._M_p);
    ppWVar3 = &this->animationScreen;
  }
  wrefresh(*ppWVar3);
LAB_00118574:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return true;
}

Assistant:

bool Screen::displayText(std::string text) {
    int i;
    std::vector<std::string> textFragments;

    if(!animationMode){
        // Update the info area
        updateInfo();

        // Remove any unwanted text
        clearWindow(textScreen);

        // Print the message
        if (text.length() > (unsigned int)textMaxLength){
            currPosition = 0;
            while((unsigned int)currPosition < text.length()){
                textFragments.push_back(text.substr((unsigned long)currPosition, (unsigned long)(currPosition + textMaxLength)));
                currPosition += textMaxLength;
            }

            for(i = currentFragment; (unsigned int)i < textFragments.size(); i++, currentFragment++){
                wclear(textScreen);
                wprintw(textScreen, textFragments[i].c_str());
                wrefresh(textScreen);

                // Reset the counter
                if((unsigned int)i == textFragments.size() - 1){
                    currentFragment = 0;
                    refreshInput();
                    continue;
                }
                else {
                    indicateMoreText();
                }
            }
        }
        else {
            currentText = text;
            wprintw(textScreen, currentText.c_str());

            // Display the message
            wrefresh(textScreen);
        }



        return true;
    }
    else{
        // Print the message
        wprintw(animationScreen, text.c_str());

        // Display the message
        wrefresh(animationScreen);

        return true;
    }
}